

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int coda_inflateSync(z_streamp strm)

{
  internal_state *piVar1;
  uLong uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uLong uVar8;
  uchar buf [4];
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 == 0) {
    piVar1 = strm->state;
    uVar4 = strm->avail_in;
    if ((uVar4 == 0) && (*(uint *)(piVar1 + 0x58) < 8)) {
      iVar6 = -5;
    }
    else {
      if (*(int *)(piVar1 + 8) != 0x3f53) {
        *(undefined4 *)(piVar1 + 8) = 0x3f53;
        uVar7 = *(ulong *)(piVar1 + 0x50) >> ((byte)*(uint *)(piVar1 + 0x58) & 7);
        *(ulong *)(piVar1 + 0x50) = uVar7;
        lVar5 = 0;
        for (iVar3 = -(*(uint *)(piVar1 + 0x58) & 0xfffffff8); iVar3 != 0; iVar3 = iVar3 + 8) {
          buf[lVar5] = (uchar)uVar7;
          lVar5 = lVar5 + 1;
          uVar7 = uVar7 >> 8;
          *(ulong *)(piVar1 + 0x50) = uVar7;
        }
        *(undefined4 *)(piVar1 + 0x58) = 0;
        *(undefined4 *)(piVar1 + 0x8c) = 0;
        syncsearch((uint *)(piVar1 + 0x8c),buf,(uint)lVar5);
        uVar4 = strm->avail_in;
      }
      uVar4 = syncsearch((uint *)(piVar1 + 0x8c),strm->next_in,uVar4);
      strm->avail_in = strm->avail_in - uVar4;
      strm->next_in = strm->next_in + uVar4;
      uVar8 = (ulong)uVar4 + strm->total_in;
      strm->total_in = uVar8;
      if (*(int *)(piVar1 + 0x8c) == 4) {
        iVar3 = *(int *)(piVar1 + 0x18);
        iVar6 = 0;
        uVar4 = 0;
        if (iVar3 != -1) {
          uVar4 = *(uint *)(piVar1 + 0x10) & 0xfffffffb;
        }
        *(uint *)(piVar1 + 0x10) = uVar4;
        uVar2 = strm->total_out;
        coda_inflateReset(strm);
        strm->total_in = uVar8;
        strm->total_out = uVar2;
        *(int *)(piVar1 + 0x18) = iVar3;
        *(undefined4 *)(piVar1 + 8) = 0x3f3f;
      }
      else {
        iVar6 = -3;
      }
    }
  }
  else {
    iVar6 = -2;
  }
  return iVar6;
}

Assistant:

int ZEXPORT inflateSync(z_streamp strm) {
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned long in, out;      /* temporary to save total_in and total_out */
    unsigned char buf[4];       /* to restore bit buffer to byte string */
    struct inflate_state FAR *state;

    /* check parameters */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8) return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold >>= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4) return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;  out = strm->total_out;
    inflateReset(strm);
    strm->total_in = in;  strm->total_out = out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}